

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::process_token_buff
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast)

{
  iterator *piVar1;
  token_base **pptVar2;
  context_t *pcVar3;
  token_base **pptVar4;
  _Map_pointer ppptVar5;
  _Map_pointer ppptVar6;
  _Elt_pointer pptVar7;
  _Elt_pointer pptVar8;
  _Elt_pointer pptVar9;
  _Map_pointer ppptVar10;
  _Elt_pointer pptVar11;
  _Elt_pointer pptVar12;
  _Elt_pointer pptVar13;
  _Map_pointer ppptVar14;
  int iVar15;
  _Map_pointer ppptVar16;
  context_t *pcVar17;
  long lVar18;
  iterator *piVar19;
  token_base **it;
  _Elt_pointer pptVar20;
  _Elt_pointer pptVar21;
  context_t *size;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *pdVar22;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *this_00;
  context_t *__args;
  _Map_pointer ppptVar23;
  _Elt_pointer pptVar24;
  token_base **ptr;
  byte bVar25;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tmp;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> expr;
  _Map_pointer local_178;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_158;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_108;
  _Map_pointer local_100;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_f8;
  token_base **local_a8;
  _Elt_pointer local_a0;
  translator_type *local_98;
  context_t *local_90;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_88;
  
  bVar25 = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_108 = ast;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_88,0);
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (token_base **)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (token_base **)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_f8,0);
  local_158._M_impl.super__Deque_impl_data._M_map =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map;
  local_158._M_impl.super__Deque_impl_data._M_map_size =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map_size;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  size = (context_t *)&local_88;
  pdVar22 = tokens;
  for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pdVar22->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)
         (((_Deque_impl *)&size->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
         super__Deque_impl_data)._M_map;
    size = (context_t *)
           &size[-(ulong)bVar25].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    pdVar22 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              ((long)pdVar22 + ((ulong)bVar25 * -2 + 1) * 8);
  }
  local_88._M_impl.super__Deque_impl_data._M_map = local_158._M_impl.super__Deque_impl_data._M_map;
  local_88._M_impl.super__Deque_impl_data._M_map_size =
       local_158._M_impl.super__Deque_impl_data._M_map_size;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish;
    local_100 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
    local_98 = &this->translator;
    local_90 = &this->context;
    local_a8 = (token_base **)&PTR__token_base_0024d040;
    local_a0 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar20 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
    __args = (context_t *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar24 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      iVar15 = (*(code *)(*(((_Deque_impl *)
                            &__args->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                           super__Deque_impl_data)._M_map)[2])();
      ppptVar16 = (((_Deque_impl *)
                   &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                  super__Deque_impl_data)._M_map;
      if ((iVar15 == 3) && (*(int *)(ppptVar16 + 2) == 0)) {
        ppptVar16 = (_Map_pointer)token_base::operator_new((token_base *)0x10,(size_t)size);
        ppptVar16[1] = (((_Deque_impl *)
                        &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                       super__Deque_impl_data)._M_map[1];
        *ppptVar16 = local_a8;
        (((_Deque_impl *)&__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
        ->super__Deque_impl_data)._M_map = ppptVar16;
      }
      iVar15 = (*(code *)(*ppptVar16)[2])();
      if ((iVar15 == 2) ||
         (iVar15 = (*(code *)(*(((_Deque_impl *)
                                &__args->
                                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                               super__Deque_impl_data)._M_map)[2])(), iVar15 == 1)) {
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          size = local_90;
          translator_type::match_grammar
                    (local_98,local_90,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
          pptVar7 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pcVar17 = (context_t *)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          pcVar3 = (context_t *)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar21 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
          pptVar2 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
          pptVar4 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
          ppptVar23 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar5 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar6 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
          while (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)pcVar3,
                local_f8._M_impl.super__Deque_impl_data._M_start._M_first = pptVar21,
                local_f8._M_impl.super__Deque_impl_data._M_start._M_last = pptVar4,
                local_f8._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar5,
                local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar6,
                pptVar20 = local_a0, ppptVar10 = ppptVar5, pcVar17 != (context_t *)pptVar7) {
            pptVar20 = (tokens->
                       super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                       _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pptVar20 ==
                (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              size = pcVar17;
              std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
              _M_push_back_aux<cs::token_base*const&>
                        ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                         (token_base **)pcVar17);
            }
            else {
              *pptVar20 = (token_base *)
                          (((_Deque_impl *)
                           &pcVar17->
                            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                          super__Deque_impl_data)._M_map;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            pcVar17 = (context_t *)
                      &(((_Deque_impl *)
                        &pcVar17->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
                       ->super__Deque_impl_data)._M_map_size;
            pcVar3 = (context_t *)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            pptVar21 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
            pptVar4 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
            ppptVar5 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
            ppptVar6 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
            if (pcVar17 == (context_t *)pptVar2) {
              pcVar17 = (context_t *)ppptVar23[1];
              ppptVar23 = ppptVar23 + 1;
              pptVar2 = (token_base **)(pcVar17 + 0x20);
            }
          }
          for (; local_a0 = pptVar20, ppptVar10 < ppptVar6; ppptVar10 = ppptVar10 + 1) {
            size = (context_t *)0x200;
            operator_delete(ppptVar10[1],0x200);
            pptVar20 = local_a0;
          }
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)pcVar3;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = pptVar21;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = pptVar4;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar5;
        }
        pcVar17 = (context_t *)
                  (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        piVar19 = piVar1;
        this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
        pptVar2 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_last;
      }
      else {
        this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_f8;
        piVar19 = &local_f8._M_impl.super__Deque_impl_data._M_finish;
        pcVar17 = (context_t *)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar2 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
      }
      if ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)pcVar17 ==
          (_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)(pptVar2 + -1)) {
        size = __args;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*const&>(this_00,(token_base **)__args);
      }
      else {
        (((_Deque_impl *)&pcVar17->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
        ->super__Deque_impl_data)._M_map =
             (_Map_pointer)
             (((_Deque_impl *)
              &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
             super__Deque_impl_data)._M_map;
        piVar19->_M_cur = piVar19->_M_cur + 1;
      }
      __args = (context_t *)
               &(((_Deque_impl *)
                 &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                super__Deque_impl_data)._M_map_size;
      if (__args == (context_t *)pptVar24) {
        __args = (context_t *)local_100[1];
        local_100 = local_100 + 1;
        pptVar24 = (_Elt_pointer)(__args + 0x20);
      }
    } while (__args != (context_t *)pptVar20);
  }
  local_158._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_158,0);
  pptVar24 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar20 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar24 != pptVar20) {
    pptVar21 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_last;
    local_178 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_158._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*const&>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_158,pptVar24);
      }
      else {
        *local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = *pptVar24;
        local_158._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_158._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      if ((*pptVar24 != (token_base *)0x0) &&
         (iVar15 = (*(*pptVar24)->_vptr_token_base[2])(), iVar15 == 1)) {
        pptVar7 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar8 = local_158._M_impl.super__Deque_impl_data._M_start._M_first;
        pptVar9 = local_158._M_impl.super__Deque_impl_data._M_start._M_last;
        ppptVar23 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
        ppptVar5 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
        ppptVar6 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
        if (1 < ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                ((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)local_158._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                ((((ulong)((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_158._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)(local_158._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x40) {
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::push_back(local_108,(value_type *)&local_158);
          pptVar7 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar8 = local_158._M_impl.super__Deque_impl_data._M_start._M_first;
          pptVar9 = local_158._M_impl.super__Deque_impl_data._M_start._M_last;
          ppptVar23 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar5 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar6 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
        }
        for (; ppptVar14 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node,
            ppptVar10 = local_158._M_impl.super__Deque_impl_data._M_start._M_node,
            pptVar13 = local_158._M_impl.super__Deque_impl_data._M_start._M_last,
            pptVar12 = local_158._M_impl.super__Deque_impl_data._M_start._M_first,
            pptVar11 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur,
            ppptVar23 < local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppptVar23 = ppptVar23 + 1) {
          local_158._M_impl.super__Deque_impl_data._M_start._M_cur = pptVar7;
          local_158._M_impl.super__Deque_impl_data._M_start._M_first = pptVar8;
          local_158._M_impl.super__Deque_impl_data._M_start._M_last = pptVar9;
          local_158._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar5;
          local_158._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar6;
          operator_delete(ppptVar23[1],0x200);
          pptVar7 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar8 = local_158._M_impl.super__Deque_impl_data._M_start._M_first;
          pptVar9 = local_158._M_impl.super__Deque_impl_data._M_start._M_last;
          ppptVar5 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar6 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
          local_158._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar14;
          local_158._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar10;
          local_158._M_impl.super__Deque_impl_data._M_start._M_last = pptVar13;
          local_158._M_impl.super__Deque_impl_data._M_start._M_first = pptVar12;
          local_158._M_impl.super__Deque_impl_data._M_start._M_cur = pptVar11;
        }
        local_158._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_158._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_158._M_impl.super__Deque_impl_data._M_start._M_first;
        local_158._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_158._M_impl.super__Deque_impl_data._M_start._M_last;
        local_158._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_158._M_impl.super__Deque_impl_data._M_start._M_node;
        local_158._M_impl.super__Deque_impl_data._M_start._M_cur = pptVar7;
        local_158._M_impl.super__Deque_impl_data._M_start._M_first = pptVar8;
        local_158._M_impl.super__Deque_impl_data._M_start._M_last = pptVar9;
        local_158._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar5;
      }
      pptVar24 = pptVar24 + 1;
      if (pptVar24 == pptVar21) {
        pptVar24 = local_178[1];
        local_178 = local_178 + 1;
        pptVar21 = pptVar24 + 0x40;
      }
    } while (pptVar24 != pptVar20);
  }
  if (1 < ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_158._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_158._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(local_158._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
          * 0x40) {
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back(local_108,(value_type *)&local_158);
  }
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_158);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_f8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
	compiler_type::process_token_buff(std::deque<token_base *> &tokens, std::deque<std::deque<token_base *>> &ast)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal &&
			        static_cast<token_signal *>(ptr)->get_signal() == signal_types::endline_)
				ptr = new token_endline(ptr->get_line_num());
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					translator.match_grammar(context, expr);
					for (auto &it: expr)
						tokens.push_back(it);
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
		std::deque<token_base *> tmp;
		for (auto &ptr: tokens) {
			tmp.push_back(ptr);
			if (ptr != nullptr && ptr->get_type() == token_types::endline) {
				if (tmp.size() > 1)
					ast.push_back(tmp);
				tmp.clear();
			}
		}
		if (tmp.size() > 1)
			ast.push_back(tmp);
	}